

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

tuple<Chainstate_*,_Chainstate_*> __thiscall
validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot(SnapshotTestSetup *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  NodeContext *node;
  path *data_dir;
  path *__p;
  ChainstateManager *this_00;
  __uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> _Var1;
  pointer psVar2;
  element_type *peVar3;
  pointer ppCVar4;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_01;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_02;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_03;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_04;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_05;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_06;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_07;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_08;
  path chaindir;
  bool bVar5;
  uint uVar6;
  int iVar7;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar8;
  Chainstate *pCVar9;
  CCoinsViewCache *pCVar10;
  Chainstate *pCVar11;
  FILE *pFVar12;
  CChainParams *this_01;
  CBlockIndex *pCVar13;
  pointer ppCVar14;
  unit_test_log_t *puVar15;
  pointer ppCVar16;
  Chainstate *pCVar17;
  Chainstate *pCVar18;
  _Head_base<0UL,_Chainstate_*,_false> extraout_RDX;
  CTransactionRef *txn;
  pointer psVar19;
  TestChain100Setup *in_RSI;
  char *pcVar20;
  iterator pvVar21;
  iterator in_R9;
  iterator pvVar22;
  size_t *psVar23;
  COutPoint *pCVar24;
  size_t *psVar25;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar26;
  int *piVar27;
  long lVar28;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  tuple<Chainstate_*,_Chainstate_*> tVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  check_type cVar33;
  AutoFile *pAVar32;
  UniValue *this_02;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffff738;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  int height;
  undefined4 uStack_78c;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  size_t coins_in_background;
  element_type *local_470;
  shared_count sStack_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  size_t initial_total_coins;
  size_t initial_size;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 local_279;
  int chains_tested;
  undefined4 uStack_274;
  pointer pbStack_270;
  pointer local_268;
  size_t new_coins;
  pointer pbStack_250;
  pointer local_248;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  shared_count sStack_230;
  path *local_228;
  path local_210;
  uint256 loaded_snapshot_blockhash;
  __index_type local_1a8;
  COutPoint op;
  bool local_170 [12];
  uchar local_164 [36];
  uint64_t local_140;
  AutoFile auto_infile;
  UniValue result;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  path snapshot_path;
  size_t total_coins;
  pointer local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(in_RSI->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
         chainman;
  pcVar20 = "m_node.chainman";
  puVar8 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                      ,0xb7,"SetupSnapshot","m_node.chainman");
  this_00 = (puVar8->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pcVar20;
  file.m_end = (iterator)0xb9;
  file.m_begin = (iterator)&local_290;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a0,msg);
  bVar5 = ChainstateManager::IsSnapshotActive(this_00);
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153d852;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!chainman.IsSnapshotActive()" + 0x1c;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a8 = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &loaded_snapshot_blockhash;
  result.typ._0_1_ = !bVar5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,_cVar33,(size_t)&local_2b0,
             0xb9);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  pvVar21 = (iterator)0xbc;
  pvVar22 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock31,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0xbc,false);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar22;
  msg_00.m_begin = pvVar21;
  file_00.m_end = (iterator)0xbd;
  file_00.m_begin = (iterator)&local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d0,
             msg_00);
  result.typ._0_1_ = 1;
  if (((this_00->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
     (_Var1._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           *(tuple<Chainstate_*,_std::default_delete<Chainstate>_> *)
            &(this_00->m_ibd_chainstate)._M_t,
     (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
     _Var1._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
     super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)) {
    result.typ._0_1_ =
         *(byte *)((long)_Var1._M_t.
                         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x38) ^ 1;
  }
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153d85e;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!chainman.IsSnapshotValidated()" + 0x1f;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d8 = "";
  pvVar21 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &loaded_snapshot_blockhash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,_cVar33,(size_t)&local_2e0,
             0xbd);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar22;
  msg_01.m_begin = pvVar21;
  file_01.m_end = (iterator)0xbe;
  file_01.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_300,
             msg_01);
  data_dir = &(this_00->m_options).datadir;
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CONCAT71(loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._1_7_,local_170[0])
       ^ 1;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
  auto_infile.m_file = (FILE *)anon_var_dwarf_153d86a;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc74b9e;
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_308 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)&result,1,0,WARN,_cVar33
             ,(size_t)&local_310,0xbe);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&op);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock31.super_unique_lock);
  initial_total_coins = 100;
  pvVar21 = (iterator)0xc6;
  pvVar22 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock31,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0xc6,false);
  pCVar9 = ChainstateManager::ActiveChainstate(this_00);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  uVar6 = CCoinsViewCache::GetCacheSize(pCVar10);
  total_coins = 0;
  initial_size = (size_t)uVar6;
  psVar2 = (in_RSI->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar19 = (in_RSI->m_coinbase_txns).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar2; psVar19 = psVar19 + 1
      ) {
    peVar3 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    op.n = 0;
    local_330 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_328 = "";
    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar22;
    msg_02.m_begin = pvVar21;
    file_02.m_end = (iterator)0xcd;
    file_02.m_begin = (iterator)&local_330;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_340,
               msg_02);
    iVar7 = (*(pCVar10->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])(pCVar10,&op);
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar7;
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    auto_infile.m_file = (FILE *)anon_var_dwarf_153d876;
    auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc74bba;
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_0113a070;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
    local_350 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_348 = "";
    pvVar21 = &DAT_00000001;
    pvVar22 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)&result,1,0,WARN,
               _cVar33,(size_t)&local_350,0xcd);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
    total_coins = total_coins + 1;
  }
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar22;
  msg_03.m_begin = pvVar21;
  file_03.m_end = (iterator)0xd1;
  file_03.m_begin = (iterator)&local_360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_370,
             msg_03);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_378 = "";
  pvVar21 = (iterator)0x2;
  psVar25 = &total_coins;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&op,&local_380,0xd1,1,2,psVar25,0xc74bc3,&initial_total_coins,"initial_total_coins");
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar25;
  msg_04.m_begin = pvVar21;
  file_04.m_end = (iterator)0xd2;
  file_04.m_begin = (iterator)&local_390;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3a0,
             msg_04);
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3a8 = "";
  pcVar20 = "initial_total_coins";
  psVar25 = &initial_total_coins;
  pvVar21 = (iterator)0x2;
  psVar23 = &initial_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&op,&local_3b0,0xd2,1,2,psVar23,0xc74bcf);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock31.super_unique_lock);
  pCVar9 = ChainstateManager::ActiveChainstate(this_00);
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar23;
  msg_05.m_begin = pvVar21;
  file_05.m_end = (iterator)0xd8;
  file_05.m_begin = (iterator)&local_3c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3d0,
             msg_05);
  bVar5 = CreateAndActivateUTXOSnapshot<__25_const>(in_RSI);
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153d8a6;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!CreateAndActivateUTXOSnapshot(this)" + 0x24;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3d8 = "";
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &loaded_snapshot_blockhash;
  result.typ._0_1_ = !bVar5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,2,0,WARN,(check_type)psVar25,
             (size_t)&local_3e0,0xd8);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar22;
  msg_06.m_begin = pvVar21;
  file_06.m_end = (iterator)0xd9;
  file_06.m_begin = (iterator)&local_3f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_400,
             msg_06);
  pCVar11 = ChainstateManager::ActiveChainstate(this_00);
  result._0_8_ = CONCAT71(result._1_7_,
                          (pCVar11->m_from_snapshot_blockhash).
                          super__Optional_base<uint256,_true,_true>._M_payload.
                          super__Optional_payload_base<uint256>._M_engaged) ^ 1;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153d8b2;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!chainman.ActiveChainstate().m_from_snapshot_blockhash" + 0x36;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_408 = "";
  pvVar21 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &loaded_snapshot_blockhash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,(check_type)psVar25,
             (size_t)&local_410,0xd9);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar22;
  msg_07.m_begin = pvVar21;
  file_07.m_end = (iterator)0xda;
  file_07.m_begin = (iterator)&local_420;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_430,
             msg_07);
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&op,this_00);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CONCAT71(loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._1_7_,
                (undefined1)op.n) ^ 1;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  criticalblock31.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_153d8be;
  criticalblock31.super_unique_lock._8_8_ = (long)"!chainman.SnapshotBlockhash()" + 0x1d;
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&criticalblock31;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_438 = "";
  uVar30 = 0;
  uVar31 = 0;
  pvVar21 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)&result,1,0,WARN,
             (check_type)psVar25,(size_t)&local_440,0xda);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  TestChain100Setup::mineBlocks(in_RSI,10);
  initial_size = initial_size + 10;
  initial_total_coins = initial_total_coins + 10;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar22;
  msg_08.m_begin = pvVar21;
  file_08.m_end = (iterator)0xf1;
  file_08.m_begin = (iterator)&local_450;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_460,
             msg_08);
  __p = &(in_RSI->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_path_root;
  std::filesystem::__cxx11::path::path((path *)&total_coins,&__p->super_path);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&op,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  iVar7 = ChainstateManager::ActiveHeight
                    ((val->_M_t).
                     super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                     .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_78c,iVar7);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock35,(path *)&total_coins);
  tinyformat::format<int>((string *)&result,"test_snapshot.%d.dat",&height);
  fs::u8path((path *)&op,(string *)&result);
  fs::operator/(&snapshot_path,(path *)&criticalblock35,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  std::__cxx11::string::~string((string *)&result);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock35);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"wb");
  new_coins = 0;
  pbStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = uVar31;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = uVar30;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)psVar25;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pcVar20;
  AutoFile::AutoFile((AutoFile *)&criticalblock31,(FILE *)pFVar12,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&new_coins);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  node = &(in_RSI->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node;
  CreateUTXOSnapshot(&result,node,pCVar11,(AutoFile *)&criticalblock31,&snapshot_path,&snapshot_path
                    );
  pCVar24 = &op;
  std::filesystem::__cxx11::path::string((string *)pCVar24,&snapshot_path.super_path);
  UniValue::write_abi_cxx11_((UniValue *)&loaded_snapshot_blockhash,(int)&result,(void *)0x0,0);
  pcVar20 = "Wrote UTXO snapshot to %s: %s\n";
  uVar30 = 2;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file._M_len = 0x66;
  logging_function._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x35,ALL,Info,(ConstevalFormatString<2U>)0xc72f1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&op);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"rb");
  _chains_tested = (pointer)0x0;
  pbStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar12,data_xor_00);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&chains_tested);
  ::node::SnapshotMetadata::SnapshotMetadata
            ((SnapshotMetadata *)&op,
             (MessageStartChars)
             *&(((((val->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                chainparams)->pchMessageStart)._M_elems);
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  SetupSnapshot::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_279,&auto_infile,(SnapshotMetadata *)&op);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar11->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar11->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar13 = (CBlockIndex *)0x0;
  }
  else {
    pCVar13 = ppCVar4[-1];
  }
  if (pCVar13->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar11->m_chain,pCVar13->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)&loaded_snapshot_blockhash,
             (val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar11->m_chain,pCVar13);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&loaded_snapshot_blockhash);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  UniValue::~UniValue(&result);
  AutoFile::~AutoFile((AutoFile *)&criticalblock31);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)&total_coins);
  coins_in_background = CONCAT71(coins_in_background._1_7_,local_1a8 != '\x01');
  local_470 = (element_type *)0x0;
  sStack_468.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_153d8ca;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_480 = "";
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&coins_in_background,(lazy_ostream *)&op,2,0,WARN,
             (check_type)pcVar20,(size_t)&local_488,0xf1);
  boost::detail::shared_count::~shared_count(&sStack_468);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar22;
  msg_09.m_begin = pvVar21;
  file_09.m_end = (iterator)0xf3;
  file_09.m_begin = (iterator)&local_498;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4a8,
             msg_09);
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CONCAT71(loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._1_7_,local_170[0])
       ^ 1;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  criticalblock31.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_153d86a;
  criticalblock31.super_unique_lock._8_8_ =
       (long)"!node::FindSnapshotChainstateDir(chainman.m_options.datadir)" + 0x3c;
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&criticalblock31;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4b0 = "";
  uVar30 = 0;
  uVar31 = 0;
  pvVar21 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)&result,1,0,WARN,
             (check_type)pcVar20,(size_t)&local_4b8,0xf3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&op);
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar22;
  msg_10.m_begin = pvVar21;
  file_10.m_end = (iterator)0xf9;
  file_10.m_begin = (iterator)&local_4c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4d8,
             msg_10);
  std::filesystem::__cxx11::path::path((path *)&total_coins,&__p->super_path);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&op,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  iVar7 = ChainstateManager::ActiveHeight
                    ((val->_M_t).
                     super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                     .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_78c,iVar7);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock35,(path *)&total_coins);
  tinyformat::format<int>((string *)&result,"test_snapshot.%d.dat",&height);
  fs::u8path((path *)&op,(string *)&result);
  fs::operator/(&snapshot_path,(path *)&criticalblock35,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  std::__cxx11::string::~string((string *)&result);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock35);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"wb");
  new_coins = 0;
  pbStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile((AutoFile *)&criticalblock31,(FILE *)pFVar12,data_xor_01);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&new_coins);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,node,pCVar11,(AutoFile *)&criticalblock31,&snapshot_path,&snapshot_path
                    );
  pCVar24 = &op;
  std::filesystem::__cxx11::path::string((string *)pCVar24,&snapshot_path.super_path);
  UniValue::write_abi_cxx11_((UniValue *)&loaded_snapshot_blockhash,(int)&result,(void *)0x0,0);
  pcVar20 = "Wrote UTXO snapshot to %s: %s\n";
  uVar30 = 2;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_00._M_len = 0x66;
  logging_function_00._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_00._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_00,source_file_00,0x35,ALL,Info,(ConstevalFormatString<2U>)0xc72f1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&op);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"rb");
  _chains_tested = (pointer)0x0;
  pbStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar12,data_xor_02);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&chains_tested);
  ::node::SnapshotMetadata::SnapshotMetadata
            ((SnapshotMetadata *)&op,
             (MessageStartChars)
             *&(((((val->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                chainparams)->pchMessageStart)._M_elems);
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_140 = local_140 + 1;
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar11->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar11->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar13 = (CBlockIndex *)0x0;
  }
  else {
    pCVar13 = ppCVar4[-1];
  }
  if (pCVar13->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar11->m_chain,pCVar13->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)&loaded_snapshot_blockhash,
             (val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar11->m_chain,pCVar13);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&loaded_snapshot_blockhash);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  UniValue::~UniValue(&result);
  AutoFile::~AutoFile((AutoFile *)&criticalblock31);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)&total_coins);
  coins_in_background = CONCAT71(coins_in_background._1_7_,local_1a8 != '\x01');
  local_470 = (element_type *)0x0;
  sStack_468.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_153d8e5;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4e0 = "";
  uVar30 = 0;
  uVar31 = 0;
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&coins_in_background,(lazy_ostream *)&op,2,0,WARN,
             (check_type)pcVar20,(size_t)&local_4e8,0xf9);
  boost::detail::shared_count::~shared_count(&sStack_468);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar22;
  msg_11.m_begin = pvVar21;
  file_11.m_end = (iterator)0xfe;
  file_11.m_begin = (iterator)&local_4f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_508,
             msg_11);
  std::filesystem::__cxx11::path::path((path *)&total_coins,&__p->super_path);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&op,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  iVar7 = ChainstateManager::ActiveHeight
                    ((val->_M_t).
                     super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                     .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_78c,iVar7);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock35,(path *)&total_coins);
  tinyformat::format<int>((string *)&result,"test_snapshot.%d.dat",&height);
  fs::u8path((path *)&op,(string *)&result);
  fs::operator/(&snapshot_path,(path *)&criticalblock35,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  std::__cxx11::string::~string((string *)&result);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock35);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"wb");
  new_coins = 0;
  pbStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile((AutoFile *)&criticalblock31,(FILE *)pFVar12,data_xor_03);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&new_coins);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,node,pCVar11,(AutoFile *)&criticalblock31,&snapshot_path,&snapshot_path
                    );
  pCVar24 = &op;
  std::filesystem::__cxx11::path::string((string *)pCVar24,&snapshot_path.super_path);
  UniValue::write_abi_cxx11_((UniValue *)&loaded_snapshot_blockhash,(int)&result,(void *)0x0,0);
  pcVar20 = "Wrote UTXO snapshot to %s: %s\n";
  uVar30 = 2;
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_01._M_len = 0x66;
  logging_function_01._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_01._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_01,source_file_01,0x35,ALL,Info,(ConstevalFormatString<2U>)0xc72f1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&op);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"rb");
  _chains_tested = (pointer)0x0;
  pbStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_04.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar12,data_xor_04);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&chains_tested);
  ::node::SnapshotMetadata::SnapshotMetadata
            ((SnapshotMetadata *)&op,
             (MessageStartChars)
             *&(((((val->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                chainparams)->pchMessageStart)._M_elems);
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_140 = local_140 - 1;
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar11->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar11->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar13 = (CBlockIndex *)0x0;
  }
  else {
    pCVar13 = ppCVar4[-1];
  }
  if (pCVar13->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar11->m_chain,pCVar13->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)&loaded_snapshot_blockhash,
             (val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar11->m_chain,pCVar13);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&loaded_snapshot_blockhash);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  UniValue::~UniValue(&result);
  AutoFile::~AutoFile((AutoFile *)&criticalblock31);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)&total_coins);
  coins_in_background = CONCAT71(coins_in_background._1_7_,local_1a8 != '\x01');
  local_470 = (element_type *)0x0;
  sStack_468.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_153d8ff;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_510 = "";
  uVar30 = 0;
  uVar31 = 0;
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&coins_in_background,(lazy_ostream *)&op,2,0,WARN,
             (check_type)pcVar20,(size_t)&local_518,0xfe);
  boost::detail::shared_count::~shared_count(&sStack_468);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar22;
  msg_12.m_begin = pvVar21;
  file_12.m_end = (iterator)0x103;
  file_12.m_begin = (iterator)&local_528;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_538,
             msg_12);
  std::filesystem::__cxx11::path::path((path *)&total_coins,&__p->super_path);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&op,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  iVar7 = ChainstateManager::ActiveHeight
                    ((val->_M_t).
                     super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                     .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_78c,iVar7);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock35,(path *)&total_coins);
  tinyformat::format<int>((string *)&result,"test_snapshot.%d.dat",&height);
  fs::u8path((path *)&op,(string *)&result);
  fs::operator/(&snapshot_path,(path *)&criticalblock35,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  std::__cxx11::string::~string((string *)&result);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock35);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"wb");
  new_coins = 0;
  pbStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_05.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile((AutoFile *)&criticalblock31,(FILE *)pFVar12,data_xor_05);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&new_coins);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,node,pCVar11,(AutoFile *)&criticalblock31,&snapshot_path,&snapshot_path
                    );
  pCVar24 = &op;
  std::filesystem::__cxx11::path::string((string *)pCVar24,&snapshot_path.super_path);
  UniValue::write_abi_cxx11_((UniValue *)&loaded_snapshot_blockhash,(int)&result,(void *)0x0,0);
  pcVar20 = "Wrote UTXO snapshot to %s: %s\n";
  uVar30 = 2;
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_02._M_len = 0x66;
  logging_function_02._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_02._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_02,source_file_02,0x35,ALL,Info,(ConstevalFormatString<2U>)0xc72f1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&op);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"rb");
  _chains_tested = (pointer)0x0;
  pbStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_06.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar12,data_xor_06);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&chains_tested);
  ::node::SnapshotMetadata::SnapshotMetadata
            ((SnapshotMetadata *)&op,
             (MessageStartChars)
             *&(((((val->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                chainparams)->pchMessageStart)._M_elems);
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_164[0x10] = '\0';
  local_164[0x11] = '\0';
  local_164[0x12] = '\0';
  local_164[0x13] = '\0';
  local_164[0x14] = '\0';
  local_164[0x15] = '\0';
  local_164[0x16] = '\0';
  local_164[0x17] = '\0';
  local_164[0x18] = '\0';
  local_164[0x19] = '\0';
  local_164[0x1a] = '\0';
  local_164[0x1b] = '\0';
  local_164[0x1c] = '\0';
  local_164[0x1d] = '\0';
  local_164[0x1e] = '\0';
  local_164[0x1f] = '\0';
  local_164[0] = '\0';
  local_164[1] = '\0';
  local_164[2] = '\0';
  local_164[3] = '\0';
  local_164[4] = '\0';
  local_164[5] = '\0';
  local_164[6] = '\0';
  local_164[7] = '\0';
  local_164[8] = '\0';
  local_164[9] = '\0';
  local_164[10] = '\0';
  local_164[0xb] = '\0';
  local_164[0xc] = '\0';
  local_164[0xd] = '\0';
  local_164[0xe] = '\0';
  local_164[0xf] = '\0';
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar11->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar11->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar13 = (CBlockIndex *)0x0;
  }
  else {
    pCVar13 = ppCVar4[-1];
  }
  if (pCVar13->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar11->m_chain,pCVar13->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)&loaded_snapshot_blockhash,
             (val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar11->m_chain,pCVar13);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&loaded_snapshot_blockhash);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  UniValue::~UniValue(&result);
  AutoFile::~AutoFile((AutoFile *)&criticalblock31);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)&total_coins);
  coins_in_background = CONCAT71(coins_in_background._1_7_,local_1a8 != '\x01');
  local_470 = (element_type *)0x0;
  sStack_468.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_153d90b;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_540 = "";
  uVar30 = 0;
  uVar31 = 0;
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&coins_in_background,(lazy_ostream *)&op,2,0,WARN,
             (check_type)pcVar20,(size_t)&local_548,0x103);
  boost::detail::shared_count::~shared_count(&sStack_468);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar22;
  msg_13.m_begin = pvVar21;
  file_13.m_end = (iterator)0x108;
  file_13.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_568,
             msg_13);
  std::filesystem::__cxx11::path::path((path *)&total_coins,&__p->super_path);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&op,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  iVar7 = ChainstateManager::ActiveHeight
                    ((val->_M_t).
                     super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                     .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _height = CONCAT44(uStack_78c,iVar7);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&op);
  std::filesystem::__cxx11::path::path((path *)&criticalblock35,(path *)&total_coins);
  tinyformat::format<int>((string *)&result,"test_snapshot.%d.dat",&height);
  fs::u8path((path *)&op,(string *)&result);
  fs::operator/(&snapshot_path,(path *)&criticalblock35,(path *)&op);
  std::filesystem::__cxx11::path::~path((path *)&op);
  std::__cxx11::string::~string((string *)&result);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock35);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"wb");
  new_coins = 0;
  pbStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_07.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile((AutoFile *)&criticalblock31,(FILE *)pFVar12,data_xor_07);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&new_coins);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CreateUTXOSnapshot(&result,node,pCVar11,(AutoFile *)&criticalblock31,&snapshot_path,&snapshot_path
                    );
  pCVar24 = &op;
  std::filesystem::__cxx11::path::string((string *)pCVar24,&snapshot_path.super_path);
  this_02 = (UniValue *)&loaded_snapshot_blockhash;
  UniValue::write_abi_cxx11_(this_02,(int)&result,(void *)0x0,0);
  pcVar20 = "Wrote UTXO snapshot to %s: %s\n";
  uVar30 = 2;
  source_file_03._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file_03._M_len = 0x66;
  logging_function_03._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function_03._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_03,source_file_03,0x35,ALL,Info,(ConstevalFormatString<2U>)0xc72f1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
  std::__cxx11::string::~string((string *)&loaded_snapshot_blockhash);
  std::__cxx11::string::~string((string *)&op);
  pFVar12 = fsbridge::fopen((char *)&snapshot_path,"rb");
  _chains_tested = (pointer)0x0;
  pbStack_270 = (pointer)0x0;
  local_268 = (pointer)0x0;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar31;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar30;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar20;
  data_xor_08.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar24;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar12,data_xor_08);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&chains_tested);
  ::node::SnapshotMetadata::SnapshotMetadata
            ((SnapshotMetadata *)&op,
             (MessageStartChars)
             *&(((((val->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                chainparams)->pchMessageStart)._M_elems);
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&op,&auto_infile);
  local_164[0x10] = '\0';
  local_164[0x11] = '\0';
  local_164[0x12] = '\0';
  local_164[0x13] = '\0';
  local_164[0x14] = '\0';
  local_164[0x15] = '\0';
  local_164[0x16] = '\0';
  local_164[0x17] = '\0';
  local_164[0x18] = '\0';
  local_164[0x19] = '\0';
  local_164[0x1a] = '\0';
  local_164[0x1b] = '\0';
  local_164[0x1c] = '\0';
  local_164[0x1d] = '\0';
  local_164[0x1e] = '\0';
  local_164[0x1f] = '\0';
  local_164[0] = '\x01';
  local_164[1] = '\0';
  local_164[2] = '\0';
  local_164[3] = '\0';
  local_164[4] = '\0';
  local_164[5] = '\0';
  local_164[6] = '\0';
  local_164[7] = '\0';
  local_164[8] = '\0';
  local_164[9] = '\0';
  local_164[10] = '\0';
  local_164[0xb] = '\0';
  local_164[0xc] = '\0';
  local_164[0xd] = '\0';
  local_164[0xe] = '\0';
  local_164[0xf] = '\0';
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar11->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar11->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar13 = (CBlockIndex *)0x0;
  }
  else {
    pCVar13 = ppCVar4[-1];
  }
  if (pCVar13->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar11->m_chain,pCVar13->pprev);
  }
  ChainstateManager::ActivateSnapshot
            ((Result<CBlockIndex_*> *)&loaded_snapshot_blockhash,
             (val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&auto_infile,
             (SnapshotMetadata *)&op,false);
  CChain::SetTip(&pCVar11->m_chain,pCVar13);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&loaded_snapshot_blockhash);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&op);
  AutoFile::~AutoFile(&auto_infile);
  UniValue::~UniValue(&result);
  AutoFile::~AutoFile((AutoFile *)&criticalblock31);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)&total_coins);
  coins_in_background = CONCAT71(coins_in_background._1_7_,local_1a8 != '\x01');
  local_470 = (element_type *)0x0;
  sStack_468.pi_ = (sp_counted_base *)0x0;
  result._0_8_ = anon_var_dwarf_153d925;
  result.val._M_dataplus._M_p = "";
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_570 = "";
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&coins_in_background,(lazy_ostream *)&op,2,0,WARN,
             (check_type)pcVar20,(size_t)&local_578,0x108);
  boost::detail::shared_count::~shared_count(&sStack_468);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar22;
  msg_14.m_begin = pvVar21;
  file_14.m_end = (iterator)0x10a;
  file_14.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_598,
             msg_14);
  bVar5 = CreateAndActivateUTXOSnapshot<__25_const>(in_RSI);
  result.typ._0_1_ = bVar5;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (long)"!CreateAndActivateUTXOSnapshot(this)" + 1;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!CreateAndActivateUTXOSnapshot(this)" + 0x24;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5a0 = "";
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       (_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&loaded_snapshot_blockhash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,2,0,WARN,(check_type)pcVar20,
             (size_t)&local_5a8,0x10a);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar22;
  msg_15.m_begin = pvVar21;
  file_15.m_end = (iterator)0x10b;
  file_15.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5c8,
             msg_15);
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  bVar5 = std::filesystem::exists((path *)&op);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  criticalblock31.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_153d94d;
  criticalblock31.super_unique_lock._8_8_ =
       (long)"fs::exists(*node::FindSnapshotChainstateDir(chainman.m_options.datadir))" + 0x48;
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&criticalblock31;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5d0 = "";
  pvVar21 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&loaded_snapshot_blockhash,(lazy_ostream *)&result,1,0,WARN,
             (check_type)pcVar20,(size_t)&local_5d8,0x10b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&op);
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar22;
  msg_16.m_begin = pvVar21;
  file_16.m_end = (iterator)0x10e;
  file_16.m_begin = (iterator)&local_5e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5f8,
             msg_16);
  pCVar11 = ChainstateManager::ActiveChainstate(this_00);
  bVar5 = base_blob<256U>::IsNull((base_blob<256U> *)&pCVar11->m_from_snapshot_blockhash);
  result.typ._0_1_ = !bVar5;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153d968;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!chainman.ActiveChainstate().m_from_snapshot_blockhash->IsNull()" + 0x40;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  op.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &loaded_snapshot_blockhash;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_600 = "";
  pvVar21 = &DAT_00000001;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&op,1,0,WARN,(check_type)pcVar20,
             (size_t)&local_608,0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar22;
  msg_17.m_begin = pvVar21;
  file_17.m_end = (iterator)0x111;
  file_17.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_628,
             msg_17);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_630 = "";
  ChainstateManager::ActiveChainstate(this_00);
  pCVar24 = &op;
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)pCVar24,this_00);
  pcVar20 = "*chainman.SnapshotBlockhash()";
  uVar30 = 0xc74ff9;
  uVar31 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&result,&local_638,0x111,1,2);
  pCVar11 = ChainstateManager::ActiveChainstate(this_00);
  pvVar21 = (iterator)0x116;
  pvVar22 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&auto_infile,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x116,false);
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)&op,data_dir);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&op);
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&op);
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar22;
  msg_18.m_begin = pvVar21;
  file_18.m_end = (iterator)0x11d;
  file_18.m_begin = (iterator)&local_648;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_658,
             msg_18);
  criticalblock31.super_unique_lock._8_8_ =
       criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  sStack_230.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = (path *)0xc694e1;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_660 = "";
  std::filesystem::__cxx11::path::path(&local_210,(path *)&result);
  chaindir.super_path._M_pathname._M_dataplus._M_p._4_4_ = uVar31;
  chaindir.super_path._M_pathname._M_dataplus._M_p._0_4_ = uVar30;
  chaindir.super_path._M_pathname._M_string_length = (size_type)pCVar24;
  chaindir.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pcVar20;
  chaindir.super_path._M_pathname.field_2._8_8_ = this_02;
  chaindir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffff738._M_head_impl;
  ::node::ReadSnapshotBaseBlockhash((optional<uint256> *)&op,chaindir);
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&loaded_snapshot_blockhash,this_00);
  pvVar21 = (iterator)0x2;
  pCVar24 = &op;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&criticalblock31,&local_668,0x11d,1,2,pCVar24,0xc7504e,
             (optional<uint256> *)&loaded_snapshot_blockhash,"*chainman.SnapshotBlockhash()");
  std::filesystem::__cxx11::path::~path(&local_210);
  std::filesystem::__cxx11::path::~path((path *)&result);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&auto_infile);
  this_01 = Params();
  CChainParams::AssumeutxoForHeight((optional<AssumeutxoData> *)&op,this_01,0x6e);
  result._0_8_ = this_00;
  pCVar13 = SetupSnapshot::anon_class_8_1_3d09f077::operator()((anon_class_8_1_3d09f077 *)&result);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)pCVar24;
  msg_19.m_begin = pvVar21;
  file_19.m_end = (iterator)0x123;
  file_19.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_688,
             msg_19);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_690 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&result,&local_698,0x123,1,2,&pCVar13->m_chain_tx_count,0xc75076,local_170,
             "au_data->m_chain_tx_count");
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&result,this_00);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] =
       (undefined1)result.val._M_string_length;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] =
       result.val._M_string_length._1_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] =
       result.val._M_string_length._2_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] =
       result.val._M_string_length._3_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] =
       result.val._M_string_length._4_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] =
       result.val._M_string_length._5_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] =
       result.val._M_string_length._6_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] =
       result.val._M_string_length._7_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = result.val.field_2._0_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = result.val.field_2._1_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = result.val.field_2._2_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = result.val.field_2._3_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = result.val.field_2._4_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = result.val.field_2._5_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = result.val.field_2._6_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = result.val.field_2._7_1_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = result._0_8_;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       result.val._M_dataplus._M_p;
  pvVar21 = (iterator)0x12c;
  psVar25 = (size_t *)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock35,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,300,false);
  _chains_tested = (pointer)((ulong)_chains_tested & 0xffffffff00000000);
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&total_coins,this_00);
  ppCVar16 = local_58;
  for (ppCVar14 = (pointer)total_coins; ppCVar14 != ppCVar16; ppCVar14 = ppCVar14 + 1) {
    pCVar18 = *ppCVar14;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    snapshot_path.super_path._M_pathname._M_string_length =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
         + 0x7b;
    snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity = 0x130;
    puVar15 = boost::unit_test::unit_test_log_t::operator<<
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                         (begin *)&snapshot_path);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&new_coins,(log_level)puVar15);
    criticalblock31.super_unique_lock._8_8_ =
         criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113fa58;
    sStack_230.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_228 = (path *)0xc750a6;
    Chainstate::ToString_abi_cxx11_((string *)&auto_infile,pCVar18);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_0113fa18;
    result.val._M_string_length = (size_type)&criticalblock31;
    result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&new_coins,(lazy_ostream *)&result);
    std::__cxx11::string::~string((string *)&auto_infile);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&new_coins);
    pCVar10 = Chainstate::CoinsTip(pCVar18);
    local_6a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_6a0 = "";
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_20.m_end = (iterator)psVar25;
    msg_20.m_begin = pvVar21;
    file_20.m_end = (iterator)0x134;
    file_20.m_begin = (iterator)&local_6a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_6b8,
               msg_20);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_01139f30;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    local_6c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_6c0 = "";
    criticalblock31.super_unique_lock._M_device =
         (mutex_type *)((ulong)criticalblock31.super_unique_lock._M_device & 0xffffffff00000000);
    uVar6 = CCoinsViewCache::GetCacheSize(pCVar10);
    auto_infile.m_file = (FILE *)CONCAT44(auto_infile.m_file._4_4_,uVar6);
    pAVar32 = &auto_infile;
    pvVar21 = (iterator)0x2;
    pUVar26 = &criticalblock31;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&result,&local_6c8,0x134,1,2,pUVar26,0xc750b9,pAVar32,"coinscache.GetCacheSize()");
    new_coins = 0;
    psVar2 = (in_RSI->m_coinbase_txns).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar19 = (in_RSI->m_coinbase_txns).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar2;
        psVar19 = psVar19 + 1) {
      peVar3 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      result._0_8_ = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      result.val._M_dataplus._M_p =
           *(pointer *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      result.val._M_string_length =
           *(size_type *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      result.val.field_2._M_allocated_capacity =
           *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      result.val.field_2._8_4_ = 0;
      local_6d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_6d0 = "";
      local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_21.m_end = (iterator)pUVar26;
      msg_21.m_begin = pvVar21;
      file_21.m_end = (iterator)0x13a;
      file_21.m_begin = (iterator)&local_6d8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_6e8,
                 msg_21);
      iVar7 = (*(pCVar10->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                        (pCVar10,&result);
      auto_infile.m_file = (FILE *)CONCAT71(auto_infile.m_file._1_7_,(char)iVar7);
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      snapshot_path.super_path._M_pathname._M_dataplus._M_p = "coinscache.HaveCoin(op)";
      snapshot_path.super_path._M_pathname._M_string_length =
           (long)"ibd_coinscache.HaveCoin(op)" + 0x1b;
      criticalblock31.super_unique_lock._8_8_ =
           criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
      sStack_230.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_228 = &snapshot_path;
      local_6f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_6f0 = "";
      pvVar21 = &DAT_00000001;
      pUVar26 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&auto_infile,(lazy_ostream *)&criticalblock31,1,0,WARN,
                 (check_type)pAVar32,(size_t)&local_6f8,0x13a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      new_coins = new_coins + 1;
    }
    local_708 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_700 = "";
    local_718 = &boost::unit_test::basic_cstring<char_const>::null;
    local_710 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_22.m_end = (iterator)pUVar26;
    msg_22.m_begin = pvVar21;
    file_22.m_end = (iterator)0x13e;
    file_22.m_begin = (iterator)&local_708;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_718,
               msg_22);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_01139f30;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    local_728 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_720 = "";
    uVar6 = CCoinsViewCache::GetCacheSize(pCVar10);
    criticalblock31.super_unique_lock._M_device =
         (mutex_type *)CONCAT44(criticalblock31.super_unique_lock._M_device._4_4_,uVar6);
    pvVar21 = (iterator)0x2;
    psVar25 = &initial_size;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result,&local_728,0x13e,1,2,psVar25,0xc74bcf,&criticalblock31,
               "coinscache.GetCacheSize()");
    local_738 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_730 = "";
    local_748 = &boost::unit_test::basic_cstring<char_const>::null;
    local_740 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_23.m_end = (iterator)psVar25;
    msg_23.m_begin = pvVar21;
    file_23.m_end = (iterator)0x13f;
    file_23.m_begin = (iterator)&local_738;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_748,
               msg_23);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_01139f30;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    local_758 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_750 = "";
    pvVar21 = (iterator)0x2;
    psVar25 = &new_coins;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&result,&local_758,0x13f,1,2,psVar25,0xc74bc3,&initial_total_coins,
               "initial_total_coins");
    _chains_tested = (pointer)CONCAT44(uStack_274,chains_tested + 1);
  }
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&total_coins);
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = (iterator)psVar25;
  msg_24.m_begin = pvVar21;
  file_24.m_end = (iterator)0x143;
  file_24.m_begin = (iterator)&local_768;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_778,
             msg_24);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_780 = "";
  criticalblock31.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock31.super_unique_lock._M_device._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&result,&local_788,0x143,1,2,&chains_tested,0xc750e3,&criticalblock31,"2");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock35.super_unique_lock);
  new_coins = 100;
  TestChain100Setup::mineBlocks(in_RSI,100);
  pvVar21 = (iterator)0x14b;
  pvVar22 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock35,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x14b,false);
  _chains_tested = (pointer)0x0;
  coins_in_background = 0;
  _height = 0;
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&total_coins,this_00);
  lVar28 = 0;
  for (ppCVar16 = (pointer)total_coins; ppCVar16 != local_58; ppCVar16 = ppCVar16 + 1) {
    pCVar18 = *ppCVar16;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    snapshot_path.super_path._M_pathname._M_string_length =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
         + 0x7b;
    snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity = 0x151;
    puVar15 = boost::unit_test::unit_test_log_t::operator<<
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                         (begin *)&snapshot_path);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_279,(log_level)puVar15);
    criticalblock31.super_unique_lock._8_8_ =
         criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113fa58;
    sStack_230.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_228 = (path *)0xc750a6;
    Chainstate::ToString_abi_cxx11_((string *)&auto_infile,pCVar18);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_0113fa18;
    result.val._M_string_length = (size_type)&criticalblock31;
    result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_279,(lazy_ostream *)&result);
    std::__cxx11::string::~string((string *)&auto_infile);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_279);
    pCVar10 = Chainstate::CoinsTip(pCVar18);
    pCVar17 = ChainstateManager::ActiveChainstate(this_00);
    psVar19 = (in_RSI->m_coinbase_txns).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (in_RSI->m_coinbase_txns).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar25 = &coins_in_background;
    if (pCVar18 == pCVar17) {
      psVar25 = (size_t *)&chains_tested;
    }
    for (; psVar19 != psVar2; psVar19 = psVar19 + 1) {
      peVar3 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      result._0_8_ = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      result.val._M_dataplus._M_p =
           *(pointer *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      result.val._M_string_length =
           *(size_type *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      result.val.field_2._M_allocated_capacity =
           *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      result.val.field_2._8_4_ = 0;
      iVar7 = (*(pCVar10->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                        (pCVar10,&result);
      if ((char)iVar7 == '\0') {
        if (pCVar18 != pCVar17) {
          lVar28 = lVar28 + 1;
          _height = lVar28;
        }
      }
      else {
        *psVar25 = *psVar25 + 1;
      }
    }
  }
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&total_coins);
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar22;
  msg_25.m_begin = pvVar21;
  file_25.m_end = (iterator)0x15f;
  file_25.m_begin = (iterator)&local_7a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_7b0,
             msg_25);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_7b8 = "";
  criticalblock31.super_unique_lock._M_device = (mutex_type *)(initial_total_coins + 100);
  pvVar21 = (iterator)0x2;
  piVar27 = &chains_tested;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&result,&local_7c0,0x15f,1,2,piVar27,0xc750f1,&criticalblock31,
             "initial_total_coins + new_coins");
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = (iterator)piVar27;
  msg_26.m_begin = pvVar21;
  file_26.m_end = (iterator)0x160;
  file_26.m_begin = (iterator)&local_7d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_7e0,
             msg_26);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_7e8 = "";
  pvVar21 = (iterator)0x2;
  psVar25 = &coins_in_background;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&result,&local_7f0,0x160,1,2,psVar25,0xc75121,&initial_total_coins,
             "initial_total_coins");
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = (iterator)psVar25;
  msg_27.m_begin = pvVar21;
  file_27.m_end = (iterator)0x161;
  file_27.m_begin = (iterator)&local_800;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_810,
             msg_27);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_818 = "";
  psVar25 = &new_coins;
  pvVar21 = (iterator)0x2;
  piVar27 = &height;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&result,&local_820,0x161,1,2,piVar27,0xc75135,psVar25,"new_coins");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock35.super_unique_lock);
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = (iterator)piVar27;
  msg_28.m_begin = pvVar21;
  file_28.m_end = (iterator)0x165;
  file_28.m_begin = (iterator)&local_830;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_840,
             msg_28);
  bVar5 = CreateAndActivateUTXOSnapshot<__25_const>(in_RSI);
  criticalblock31.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock31.super_unique_lock._M_device._1_7_,!bVar5);
  criticalblock31.super_unique_lock._M_owns = false;
  criticalblock31.super_unique_lock._9_7_ = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  auto_infile.m_file = (FILE *)anon_var_dwarf_153d8a6;
  auto_infile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc74c00;
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_0113a070;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)&auto_infile;
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_848 = "";
  pvVar21 = (iterator)0x2;
  pvVar22 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock31,(lazy_ostream *)&result,2,0,WARN,
             (check_type)psVar25,(size_t)&local_850,0x165);
  boost::detail::shared_count::~shared_count(&sStack_230);
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar22;
  msg_29.m_begin = pvVar21;
  file_29.m_end = (iterator)0x16a;
  file_29.m_begin = (iterator)&local_860;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_870,
             msg_29);
  result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
  result._0_8_ = &PTR__lazy_ostream_01139f30;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_878 = "";
  pCVar18 = ChainstateManager::ActiveChainstate(this_00);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&result,&local_880,0x16a,1,2,&pCVar18->m_from_snapshot_blockhash,0xc74ff9,
             &loaded_snapshot_blockhash,"loaded_snapshot_blockhash");
  *(Chainstate **)
   &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
    super_BasicTestingSetup.m_interrupt = pCVar11;
  *(Chainstate **)
   &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
    super_BasicTestingSetup.m_interrupt.m_pipe_w = pCVar9;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    tVar29.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
    super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
    tVar29.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.super__Tuple_impl<1UL,_Chainstate_*>.
    super__Head_base<1UL,_Chainstate_*,_false>._M_head_impl =
         (_Head_base<1UL,_Chainstate_*,_false>)(_Head_base<1UL,_Chainstate_*,_false>)this;
    return (tuple<Chainstate_*,_Chainstate_*>)
           tVar29.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>;
  }
  __stack_chk_fail();
}

Assistant:

std::tuple<Chainstate*, Chainstate*> SetupSnapshot()
    {
        ChainstateManager& chainman = *Assert(m_node.chainman);

        BOOST_CHECK(!chainman.IsSnapshotActive());

        {
            LOCK(::cs_main);
            BOOST_CHECK(!chainman.IsSnapshotValidated());
            BOOST_CHECK(!node::FindSnapshotChainstateDir(chainman.m_options.datadir));
        }

        size_t initial_size;
        size_t initial_total_coins{100};

        // Make some initial assertions about the contents of the chainstate.
        {
            LOCK(::cs_main);
            CCoinsViewCache& ibd_coinscache = chainman.ActiveChainstate().CoinsTip();
            initial_size = ibd_coinscache.GetCacheSize();
            size_t total_coins{0};

            for (CTransactionRef& txn : m_coinbase_txns) {
                COutPoint op{txn->GetHash(), 0};
                BOOST_CHECK(ibd_coinscache.HaveCoin(op));
                total_coins++;
            }

            BOOST_CHECK_EQUAL(total_coins, initial_total_coins);
            BOOST_CHECK_EQUAL(initial_size, initial_total_coins);
        }

        Chainstate& validation_chainstate = chainman.ActiveChainstate();

        // Snapshot should refuse to load at this height.
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(this));
        BOOST_CHECK(!chainman.ActiveChainstate().m_from_snapshot_blockhash);
        BOOST_CHECK(!chainman.SnapshotBlockhash());

        // Mine 10 more blocks, putting at us height 110 where a valid assumeutxo value can
        // be found.
        constexpr int snapshot_height = 110;
        mineBlocks(10);
        initial_size += 10;
        initial_total_coins += 10;

        // Should not load malleated snapshots
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // A UTXO is missing but count is correct
                metadata.m_coins_count -= 1;

                Txid txid;
                auto_infile >> txid;
                // coins size
                (void)ReadCompactSize(auto_infile);
                // vout index
                (void)ReadCompactSize(auto_infile);
                Coin coin;
                auto_infile >> coin;
        }));

        BOOST_CHECK(!node::FindSnapshotChainstateDir(chainman.m_options.datadir));

        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Coins count is larger than coins in file
                metadata.m_coins_count += 1;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Coins count is smaller than coins in file
                metadata.m_coins_count -= 1;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Wrong hash
                metadata.m_base_blockhash = uint256::ZERO;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Wrong hash
                metadata.m_base_blockhash = uint256::ONE;
        }));

        BOOST_REQUIRE(CreateAndActivateUTXOSnapshot(this));
        BOOST_CHECK(fs::exists(*node::FindSnapshotChainstateDir(chainman.m_options.datadir)));

        // Ensure our active chain is the snapshot chainstate.
        BOOST_CHECK(!chainman.ActiveChainstate().m_from_snapshot_blockhash->IsNull());
        BOOST_CHECK_EQUAL(
            *chainman.ActiveChainstate().m_from_snapshot_blockhash,
            *chainman.SnapshotBlockhash());

        Chainstate& snapshot_chainstate = chainman.ActiveChainstate();

        {
            LOCK(::cs_main);

            fs::path found = *node::FindSnapshotChainstateDir(chainman.m_options.datadir);

            // Note: WriteSnapshotBaseBlockhash() is implicitly tested above.
            BOOST_CHECK_EQUAL(
                *node::ReadSnapshotBaseBlockhash(found),
                *chainman.SnapshotBlockhash());
        }

        const auto& au_data = ::Params().AssumeutxoForHeight(snapshot_height);
        const CBlockIndex* tip = WITH_LOCK(chainman.GetMutex(), return chainman.ActiveTip());

        BOOST_CHECK_EQUAL(tip->m_chain_tx_count, au_data->m_chain_tx_count);

        // To be checked against later when we try loading a subsequent snapshot.
        uint256 loaded_snapshot_blockhash{*chainman.SnapshotBlockhash()};

        // Make some assertions about the both chainstates. These checks ensure the
        // legacy chainstate hasn't changed and that the newly created chainstate
        // reflects the expected content.
        {
            LOCK(::cs_main);
            int chains_tested{0};

            for (Chainstate* chainstate : chainman.GetAll()) {
                BOOST_TEST_MESSAGE("Checking coins in " << chainstate->ToString());
                CCoinsViewCache& coinscache = chainstate->CoinsTip();

                // Both caches will be empty initially.
                BOOST_CHECK_EQUAL((unsigned int)0, coinscache.GetCacheSize());

                size_t total_coins{0};

                for (CTransactionRef& txn : m_coinbase_txns) {
                    COutPoint op{txn->GetHash(), 0};
                    BOOST_CHECK(coinscache.HaveCoin(op));
                    total_coins++;
                }

                BOOST_CHECK_EQUAL(initial_size , coinscache.GetCacheSize());
                BOOST_CHECK_EQUAL(total_coins, initial_total_coins);
                chains_tested++;
            }

            BOOST_CHECK_EQUAL(chains_tested, 2);
        }

        // Mine some new blocks on top of the activated snapshot chainstate.
        constexpr size_t new_coins{100};
        mineBlocks(new_coins);  // Defined in TestChain100Setup.

        {
            LOCK(::cs_main);
            size_t coins_in_active{0};
            size_t coins_in_background{0};
            size_t coins_missing_from_background{0};

            for (Chainstate* chainstate : chainman.GetAll()) {
                BOOST_TEST_MESSAGE("Checking coins in " << chainstate->ToString());
                CCoinsViewCache& coinscache = chainstate->CoinsTip();
                bool is_background = chainstate != &chainman.ActiveChainstate();

                for (CTransactionRef& txn : m_coinbase_txns) {
                    COutPoint op{txn->GetHash(), 0};
                    if (coinscache.HaveCoin(op)) {
                        (is_background ? coins_in_background : coins_in_active)++;
                    } else if (is_background) {
                        coins_missing_from_background++;
                    }
                }
            }

            BOOST_CHECK_EQUAL(coins_in_active, initial_total_coins + new_coins);
            BOOST_CHECK_EQUAL(coins_in_background, initial_total_coins);
            BOOST_CHECK_EQUAL(coins_missing_from_background, new_coins);
        }

        // Snapshot should refuse to load after one has already loaded.
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(this));

        // Snapshot blockhash should be unchanged.
        BOOST_CHECK_EQUAL(
            *chainman.ActiveChainstate().m_from_snapshot_blockhash,
            loaded_snapshot_blockhash);
        return std::make_tuple(&validation_chainstate, &snapshot_chainstate);
    }